

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

void adios2::utils::print_decomp<unsigned_long>(Engine *fp,IO *io,Variable<unsigned_long> *variable)

{
  unsigned_long uVar1;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  size_type sVar6;
  reference pvVar7;
  pointer ppVar8;
  reference ppVar9;
  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
  *this;
  reference pvVar10;
  reference pvVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>
  *in_RDI;
  Dims *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  Variable<unsigned_long> *in_stack_00000018;
  IO *in_stack_00000020;
  Engine *in_stack_00000028;
  Dims *in_stack_00000040;
  size_t k_3;
  size_t j_3;
  size_t blocksSize_1;
  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
  *blocks_3;
  size_t stepAbsolute_1;
  pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>
  *blockpair_1;
  iterator __end0_1;
  iterator __begin0_1;
  map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
  *__range3_1;
  size_t stepRelative;
  size_t k_2;
  int ndigits_nblocks_1;
  size_t ndim_1;
  size_t j_2;
  int col_1;
  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
  *blocks_2;
  size_t step;
  pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>
  *blockpair;
  iterator __end0;
  iterator __begin0;
  map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
  *__range3;
  int ndigits_nsteps;
  size_t laststep;
  map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
  allblocks;
  Dims c_1;
  Dims s_1;
  size_t s;
  size_t c;
  size_t k_1;
  size_t j_1;
  size_t blocksSize;
  size_t stepAbsolute;
  size_t k;
  int ndigits_nblocks;
  size_t ndim;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> blocks_1;
  MinVarInfo *minBlocksInfo_1;
  size_t RelStep_1;
  size_t j;
  int col;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> blocks;
  MinVarInfo *minBlocksInfo;
  size_t RelStep;
  int ndigits_nsteps_1;
  size_t laststep_1;
  MinVarInfo *mBI;
  DataType adiosvartype;
  map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
  *in_stack_fffffffffffffb68;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>
  *in_stack_fffffffffffffb70;
  allocator_type *in_stack_fffffffffffffb78;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *in_stack_fffffffffffffb80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  iterator in_stack_fffffffffffffb88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb90;
  allocator_type *in_stack_fffffffffffffb98;
  FILE *pFVar12;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  uint uVar13;
  unsigned_long *in_stack_fffffffffffffba8;
  value_type vVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  uint in_stack_fffffffffffffbbc;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *in_stack_fffffffffffffbc0;
  undefined1 *in_stack_fffffffffffffc98;
  long in_stack_fffffffffffffca0;
  void *in_stack_fffffffffffffca8;
  ulong local_2f8;
  ulong local_2f0;
  _Self local_2c8;
  _Self local_2c0;
  Variable *local_2b8;
  long local_2b0;
  size_type local_2a8;
  uint local_29c;
  ulong local_298;
  ulong local_290;
  int local_284;
  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
  *local_280;
  unsigned_long local_278;
  reference local_270;
  _Self local_268;
  _Self local_260;
  Variable *local_258;
  uint local_24c;
  unsigned_long local_240;
  undefined4 local_234;
  Variable local_230 [199];
  undefined1 local_169 [25];
  undefined8 local_150;
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 local_128;
  undefined8 *local_120;
  undefined8 local_118;
  long local_e0;
  void *local_d8;
  ulong local_d0;
  ulong local_c8;
  size_type local_c0;
  undefined8 local_b8;
  size_type local_b0;
  uint local_a4;
  ulong local_a0;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> local_98;
  undefined8 *local_80;
  pointer local_78;
  ulong local_70;
  int local_64;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> local_60;
  undefined8 *local_48;
  pointer local_40;
  uint local_34;
  undefined8 local_30;
  undefined8 *local_28;
  undefined4 local_1c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>
  *local_8;
  
  local_1c = *(undefined4 *)
              &in_RDX[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  local_28 = (undefined8 *)0x0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  puVar5 = (undefined8 *)
           (*(code *)in_RDI->_M_node[2]._M_right)
                     (in_RDI,in_RDX,
                      (long)in_RDX[10].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -1);
  local_28 = puVar5;
  if (puVar5 == (undefined8 *)0x0) {
    adios2::core::Engine::AllStepsBlocksInfo<unsigned_long>(local_230);
    bVar3 = std::
            map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
            ::empty((map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
                     *)0x1acd7e);
    if (bVar3) {
      local_234 = 1;
    }
    else {
      std::
      map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
      ::rbegin(in_stack_fffffffffffffb68);
      ppVar8 = std::
               reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
               ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
                             *)in_stack_fffffffffffffb70);
      local_240 = ppVar8->first;
      local_24c = ndigits(0x1acde8);
      if ((*(int *)&local_18[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == 1) ||
         (*(int *)&local_18[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage == 4)) {
        local_258 = local_230;
        local_260._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
             ::begin(in_stack_fffffffffffffb68);
        local_268._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
             ::end(in_stack_fffffffffffffb68);
        while (bVar3 = std::operator!=(&local_260,&local_268), bVar3) {
          local_270 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>
                      ::operator*(in_stack_fffffffffffffb70);
          local_278 = local_270->first;
          local_280 = &local_270->second;
          fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_24c,
                  local_278);
          sVar6 = std::
                  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                  ::size(local_280);
          pFVar12 = outf;
          if (sVar6 == 1) {
            fprintf(outf," = ");
            std::
            vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
            ::operator[](local_280,0);
            print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                       (DataType)in_stack_fffffffffffffca0,
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
            fprintf(outf,"\n");
          }
          else {
            sVar6 = std::
                    vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                    ::size(local_280);
            fprintf(pFVar12,"%zu instances available\n",sVar6);
          }
          if ((dump & 1) != 0) {
            fprintf(outf,"               ");
            local_284 = 0;
            for (local_290 = 0; uVar2 = local_290,
                sVar6 = std::
                        vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                        ::size(local_280), uVar2 < sVar6; local_290 = local_290 + 1) {
              std::
              vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
              ::operator[](local_280,local_290);
              print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                         (DataType)in_stack_fffffffffffffca0,
                         SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                         SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
              uVar2 = local_290;
              local_284 = local_284 + 1;
              sVar6 = std::
                      vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                      ::size(local_280);
              if (uVar2 < sVar6 - 1) {
                if (local_284 < ncols) {
                  fprintf(outf," ");
                }
                else {
                  fprintf(outf,"\n               ");
                  local_284 = 0;
                }
              }
            }
            fprintf(outf,"\n");
          }
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>
          ::operator++(in_stack_fffffffffffffb70);
        }
        local_234 = 1;
      }
      else {
        local_298 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &local_18[5].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        for (local_2a8 = 0; local_2a8 < local_298; local_2a8 = local_2a8 + 1) {
          if (*(int *)&local_18[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage == 2) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &local_18[3].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_2a8);
            iVar4 = ndigits(0x1ad16a);
            *(int *)(ndigits_dims + local_2a8 * 4) = iVar4;
          }
          else {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &local_18[5].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_2a8);
            iVar4 = ndigits(0x1ad1a8);
            *(int *)(ndigits_dims + local_2a8 * 4) = iVar4;
          }
        }
        local_2b0 = 0;
        local_2b8 = local_230;
        local_2c0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
             ::begin(in_stack_fffffffffffffb68);
        local_2c8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
             ::end(in_stack_fffffffffffffb68);
        while (bVar3 = std::operator!=(&local_2c0,&local_2c8), bVar3) {
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>
                   ::operator*(in_stack_fffffffffffffb70);
          uVar1 = ppVar9->first;
          this = &ppVar9->second;
          sVar6 = std::
                  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                  ::size(this);
          fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_24c,uVar1);
          fprintf(outf,"\n");
          local_29c = ndigits(0x1ad2dd);
          for (local_2f0 = 0; local_2f0 < sVar6; local_2f0 = local_2f0 + 1) {
            fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar,(ulong)local_29c,
                    local_2f0);
            local_298 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_18[5].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            for (local_2f8 = 0; local_2f8 < local_298; local_2f8 = local_2f8 + 1) {
              pvVar10 = std::
                        vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                        ::operator[](this,local_2f0);
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&pvVar10->Count,local_2f8);
              if (*pvVar11 == 0) {
                fprintf(outf,"%-*s",(ulong)(*(int *)(ndigits_dims + local_2f8 * 4) * 2 + 1),"null");
              }
              else if (*(int *)&local_18[2].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage == 2) {
                in_stack_fffffffffffffbbc = *(uint *)(ndigits_dims + local_2f8 * 4);
                pFVar12 = outf;
                pvVar10 = std::
                          vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                          ::operator[](this,local_2f0);
                pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&pvVar10->Start,local_2f8);
                in_stack_fffffffffffffbc0 =
                     (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)*pvVar11
                ;
                uVar13 = *(uint *)(ndigits_dims + local_2f8 * 4);
                pvVar10 = std::
                          vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                          ::operator[](this,local_2f0);
                pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&pvVar10->Start,local_2f8);
                vVar14 = *pvVar11;
                pvVar10 = std::
                          vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                          ::operator[](this,local_2f0);
                pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&pvVar10->Count,local_2f8);
                fprintf(pFVar12,"%*zu:%*zu",(ulong)in_stack_fffffffffffffbbc,
                        in_stack_fffffffffffffbc0,(ulong)uVar13,vVar14 + *pvVar11 + -1);
              }
              else {
                uVar13 = *(uint *)(ndigits_dims + local_2f8 * 4);
                pFVar12 = outf;
                pvVar10 = std::
                          vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                          ::operator[](this,local_2f0);
                pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&pvVar10->Count,local_2f8);
                fprintf(pFVar12,"0:%*zu",(ulong)uVar13,*pvVar11 - 1);
              }
              if (local_2f8 < local_298 - 1) {
                fprintf(outf,", ");
              }
            }
            fprintf(outf,"]");
            if ((longopt & 1) != 0) {
              fprintf(outf," = ");
              std::
              vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
              ::operator[](this,local_2f0);
              print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                         (DataType)in_stack_fffffffffffffca0,
                         SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                         SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
              fprintf(outf," / ");
              std::
              vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
              ::operator[](this,local_2f0);
              print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                         (DataType)in_stack_fffffffffffffca0,
                         SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                         SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
            }
            fprintf(outf,"\n");
            if ((dump & 1) != 0) {
              in_stack_fffffffffffffb70 = local_8;
              this_00 = local_18;
              std::
              vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
              ::operator[](this,local_2f0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffbc0,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              std::
              vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
              ::operator[](this,local_2f0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffbc0,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              readVarBlock<unsigned_long>
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                         in_stack_00000008,unaff_retaddr,in_stack_00000040);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
            }
          }
          local_2b0 = local_2b0 + 1;
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>
          ::operator++(in_stack_fffffffffffffb70);
        }
        local_234 = 0;
      }
    }
    std::
    map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
    ::~map((map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
            *)0x1ad7e5);
  }
  else {
    local_30 = *puVar5;
    if (puVar5 != (undefined8 *)0x0) {
      MinVarInfo::~MinVarInfo((MinVarInfo *)0x1abeb3);
      operator_delete(puVar5);
    }
    local_34 = ndigits(0x1abecd);
    if ((*(int *)&local_18[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage == 1) ||
       (*(int *)&local_18[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage == 4)) {
      for (local_40 = (pointer)0x0;
          local_40 <
          local_18[10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_40 = (pointer)((long)local_40 + 1)) {
        local_48 = (undefined8 *)(*(code *)local_8->_M_node[2]._M_right)(local_8,local_18,local_40);
        std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
                  (in_stack_fffffffffffffbc0,
                   (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_34,*local_48)
        ;
        sVar6 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                          (&local_60);
        pFVar12 = outf;
        if (sVar6 == 1) {
          fprintf(outf," = ");
          std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                    (&local_60,0);
          print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                     (DataType)in_stack_fffffffffffffca0,
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
          fprintf(outf,"\n");
        }
        else {
          sVar6 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                            (&local_60);
          fprintf(pFVar12,"%zu instances available\n",sVar6);
        }
        if ((dump & 1) != 0) {
          fprintf(outf,"               ");
          local_64 = 0;
          for (local_70 = 0; uVar2 = local_70,
              sVar6 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                                (&local_60), uVar2 < sVar6; local_70 = local_70 + 1) {
            std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                      (&local_60,local_70);
            print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                       (DataType)in_stack_fffffffffffffca0,
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
            uVar2 = local_70;
            local_64 = local_64 + 1;
            sVar6 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                              (&local_60);
            if (uVar2 < sVar6 - 1) {
              if (local_64 < ncols) {
                fprintf(outf," ");
              }
              else {
                fprintf(outf,"\n               ");
                local_64 = 0;
              }
            }
          }
          fprintf(outf,"\n");
        }
        puVar5 = local_48;
        if (local_48 != (undefined8 *)0x0) {
          MinVarInfo::~MinVarInfo((MinVarInfo *)0x1ac1a1);
          operator_delete(puVar5);
        }
        std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::~vector
                  (in_stack_fffffffffffffb80);
      }
    }
    else {
      for (local_78 = (pointer)0x0;
          local_78 <
          local_18[10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_78 = (pointer)((long)local_78 + 1)) {
        local_80 = (undefined8 *)(*(code *)local_8->_M_node[2]._M_right)(local_8,local_18,local_78);
        std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
                  (in_stack_fffffffffffffbc0,
                   (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        local_a0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &local_18[5].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        for (local_b0 = 0; local_b0 < local_a0; local_b0 = local_b0 + 1) {
          if (*(int *)&local_18[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage == 2) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &local_18[3].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_b0);
            iVar4 = ndigits(0x1ac2b2);
            *(int *)(ndigits_dims + local_b0 * 4) = iVar4;
          }
          else {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &local_18[5].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_b0);
            iVar4 = ndigits(0x1ac2f0);
            *(int *)(ndigits_dims + local_b0 * 4) = iVar4;
          }
        }
        local_b8 = *local_80;
        fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_34,local_b8);
        fprintf(outf,"\n");
        local_c0 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                             (&local_98);
        local_a4 = ndigits(0x1ac398);
        for (local_c8 = 0; puVar5 = local_80, local_c8 < local_c0; local_c8 = local_c8 + 1) {
          fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar,(ulong)local_a4,
                  local_c8);
          local_a0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &local_18[5].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
          for (local_d0 = 0; local_d0 < local_a0; local_d0 = local_d0 + 1) {
            if ((*(byte *)(local_80 + 1) & 1) == 0) {
              pvVar7 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                       operator[](&local_98,local_c8);
              in_stack_fffffffffffffca8 = *(void **)(*(long *)(pvVar7 + 0x18) + local_d0 * 8);
            }
            else {
              pvVar7 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                       operator[](&local_98,local_c8);
              in_stack_fffffffffffffca8 = *(void **)(pvVar7 + 0x18);
            }
            local_d8 = in_stack_fffffffffffffca8;
            if (in_stack_fffffffffffffca8 == (void *)0x0) {
              fprintf(outf,"%-*s",(ulong)(*(int *)(ndigits_dims + local_d0 * 4) * 2 + 1),"null");
            }
            else if (*(int *)&local_18[2].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage == 2) {
              if ((*(byte *)(local_80 + 1) & 1) == 0) {
                pvVar7 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                         operator[](&local_98,local_c8);
                in_stack_fffffffffffffca0 = *(long *)(*(long *)(pvVar7 + 0x10) + local_d0 * 8);
              }
              else {
                pvVar7 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                         operator[](&local_98,local_c8);
                in_stack_fffffffffffffca0 = *(long *)(pvVar7 + 0x10);
              }
              local_e0 = in_stack_fffffffffffffca0;
              fprintf(outf,"%*zu:%*zu",(ulong)*(uint *)(ndigits_dims + local_d0 * 4),
                      in_stack_fffffffffffffca0,(ulong)*(uint *)(ndigits_dims + local_d0 * 4),
                      (long)local_d8 + in_stack_fffffffffffffca0 + -1);
            }
            else {
              fprintf(outf,"0:%*zu",(ulong)*(uint *)(ndigits_dims + local_d0 * 4),
                      (long)in_stack_fffffffffffffca8 + -1);
            }
            if (local_d0 < local_a0 - 1) {
              fprintf(outf,", ");
            }
          }
          fprintf(outf,"]");
          if ((longopt & 1) != 0) {
            fprintf(outf," = ");
            std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                      (&local_98,local_c8);
            print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                       (DataType)in_stack_fffffffffffffca0,
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
            fprintf(outf," / ");
            std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                      (&local_98,local_c8);
            print_data(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                       (DataType)in_stack_fffffffffffffca0,
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                       SUB81((ulong)in_stack_fffffffffffffc98 >> 0x30,0));
          }
          fprintf(outf,"\n");
          if ((dump & 1) != 0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ac711);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ac71e);
            if (*(int *)&local_18[2].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage == 2) {
              if ((*(byte *)(local_80 + 1) & 1) == 0) {
                std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                          (&local_98,local_c8);
                std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                          (&local_98,local_c8);
                in_stack_fffffffffffffc98 = local_169;
                std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1ac883);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                vector<unsigned_long*,void>
                          (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                           (unsigned_long *)
                           CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           in_stack_fffffffffffffb98);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb80,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb78);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb80);
                std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1ac8e1);
                std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                          (&local_98,local_c8);
                std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                          (&local_98,local_c8);
                std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1ac94c);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                vector<unsigned_long*,void>
                          (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                           (unsigned_long *)
                           CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           in_stack_fffffffffffffb98);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb80,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb78);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb80);
                std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1ac9a2);
              }
              else {
                pvVar7 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                         operator[](&local_98,local_c8);
                local_128 = *(undefined8 *)(pvVar7 + 0x18);
                local_120 = &local_128;
                local_118 = 1;
                __l._M_len = (size_type)in_stack_fffffffffffffb90;
                __l._M_array = in_stack_fffffffffffffb88;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb80,__l);
                pvVar7 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                         operator[](&local_98,local_c8);
                local_150 = *(undefined8 *)(pvVar7 + 0x10);
                local_148 = &local_150;
                local_140 = 1;
                __l_00._M_len = (size_type)in_stack_fffffffffffffb90;
                __l_00._M_array = in_stack_fffffffffffffb88;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb80,__l_00);
              }
            }
            else {
              std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                        (&local_98,local_c8);
              std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                        (&local_98,local_c8);
              std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1aca60);
              std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long*,void>
                        (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                         (unsigned_long *)
                         CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                         in_stack_fffffffffffffb98);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb80,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb78);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb80);
              std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1acabe);
              std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1acad3);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (in_stack_fffffffffffffb90,(size_type)in_stack_fffffffffffffb88,
                         (value_type_conflict1 *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                        );
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb80,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb78);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb80);
              std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1acb25);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffbc0,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffbc0,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
            readVarBlock<unsigned_long>
                      (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                       in_stack_00000008,unaff_retaddr,in_stack_00000040);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffb80);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffb80);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffb80);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffb80);
          }
        }
        if (local_80 != (undefined8 *)0x0) {
          MinVarInfo::~MinVarInfo((MinVarInfo *)0x1acd1a);
          operator_delete(puVar5);
        }
        std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::~vector
                  (in_stack_fffffffffffffb80);
      }
    }
  }
  return;
}

Assistant:

void print_decomp(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    /* Print block info */
    DataType adiosvartype = variable->m_Type;

    MinVarInfo *mBI = nullptr;
    mBI = fp->MinBlocksInfo(*variable, variable->m_AvailableStepsCount - 1 /* relative step 0 */);

    // first step
    if (mBI)
    {
        size_t laststep = mBI->Step; // used relative last step above
        delete mBI;
        int ndigits_nsteps = ndigits(laststep);
        if (variable->m_ShapeID == ShapeID::GlobalValue ||
            variable->m_ShapeID == ShapeID::LocalValue)
        {
            for (size_t RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                auto minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                auto blocks = minBlocksInfo->BlocksInfo;
                fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps,
                        minBlocksInfo->Step);
                if (blocks.size() == 1)
                {
                    fprintf(outf, " = ");
                    print_data(blocks[0].BufferP, 0, adiosvartype, true, /* MBI */ true);
                    fprintf(outf, "\n");
                }
                else
                {
                    fprintf(outf, "%zu instances available\n", blocks.size());
                }
                if (dump)
                {
                    fprintf(outf, "               ");
                    int col = 0;
                    for (size_t j = 0; j < blocks.size(); j++)
                    {
                        print_data(blocks[j].BufferP, 0, adiosvartype, true, /* MBI */ true);
                        ++col;
                        if (j < blocks.size() - 1)
                        {
                            if (col < ncols)
                            {
                                fprintf(outf, " ");
                            }
                            else
                            {
                                fprintf(outf, "\n               ");
                                col = 0;
                            }
                        }
                    }
                    fprintf(outf, "\n");
                }
                delete minBlocksInfo;
            }
        }
        else
        {
            // arrays
            for (size_t RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                auto minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                auto blocks = minBlocksInfo->BlocksInfo;
                size_t ndim = variable->m_Count.size();
                int ndigits_nblocks;
                for (size_t k = 0; k < ndim; k++)
                {
                    // get digit lengths for each dimension
                    if (variable->m_ShapeID == ShapeID::GlobalArray)
                    {
                        ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
                    }
                    else
                    {
                        ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
                    }
                }

                size_t stepAbsolute = minBlocksInfo->Step;

                fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, stepAbsolute);
                fprintf(outf, "\n");
                const size_t blocksSize = blocks.size();
                ndigits_nblocks = ndigits(blocksSize - 1);

                for (size_t j = 0; j < blocksSize; j++)
                {
                    fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

                    // just in case ndim for a block changes in LocalArrays:
                    ndim = variable->m_Count.size();

                    for (size_t k = 0; k < ndim; k++)
                    {
                        size_t c = (minBlocksInfo->WasLocalValue
                                        ? reinterpret_cast<size_t>(blocks[j].Count)
                                        : blocks[j].Count[k]);

                        if (c)
                        {
                            if (variable->m_ShapeID == ShapeID::GlobalArray)
                            {
                                size_t s = (minBlocksInfo->WasLocalValue
                                                ? reinterpret_cast<size_t>(blocks[j].Start)
                                                : blocks[j].Start[k]);
                                fprintf(outf, "%*zu:%*zu", ndigits_dims[k], s, ndigits_dims[k],
                                        s + c - 1);
                            }
                            else
                            {
                                // blockStart is empty vector for LocalArrays
                                fprintf(outf, "0:%*zu", ndigits_dims[k], c - 1);
                            }
                        }
                        else
                        {
                            fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                        }
                        if (k < ndim - 1)
                            fprintf(outf, ", ");
                    }
                    fprintf(outf, "]");

                    /* Print per-block statistics if available */
                    if (longopt)
                    {
                        if (true /* TODO: variable->has_minmax */)
                        {
                            fprintf(outf, " = ");
                            print_data(&blocks[j].MinMax.MinUnion, 0, adiosvartype, false);

                            fprintf(outf, " / ");
                            print_data(&blocks[j].MinMax.MaxUnion, 0, adiosvartype, false);
                        }
                        else
                        {
                            fprintf(outf, "N/A / N/A");
                        }
                    }
                    fprintf(outf, "\n");
                    if (dump)
                    {
                        Dims s, c;
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            if (minBlocksInfo->WasLocalValue)
                            {
                                c = {reinterpret_cast<size_t>(blocks[j].Count)};
                                s = {reinterpret_cast<size_t>(blocks[j].Start)};
                            }
                            else
                            {
                                c = Dims(blocks[j].Count, blocks[j].Count + ndim);
                                s = Dims(blocks[j].Start, blocks[j].Start + ndim);
                            }
                        }
                        else
                        {
                            c = Dims(blocks[j].Count, blocks[j].Count + ndim);
                            s = Dims(0, ndim);
                        }
                        readVarBlock(fp, io, variable, RelStep, j, c, s);
                    }
                }
                delete minBlocksInfo;
            }
        }
        return;
    }

    std::map<size_t, std::vector<typename core::Variable<T>::BPInfo>> allblocks =
        fp->AllStepsBlocksInfo(*variable);
    if (allblocks.empty())
    {
        return;
    }
    size_t laststep = allblocks.rbegin()->first;
    int ndigits_nsteps = ndigits(laststep);
    if (variable->m_ShapeID == ShapeID::GlobalValue || variable->m_ShapeID == ShapeID::LocalValue)
    {
        // scalars
        for (auto &blockpair : allblocks)
        {
            size_t step = blockpair.first;
            std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
            fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, step);
            if (blocks.size() == 1)
            {
                fprintf(outf, " = ");
                print_data(&blocks[0].Value, 0, adiosvartype, true);
                fprintf(outf, "\n");
            }
            else
            {
                fprintf(outf, "%zu instances available\n", blocks.size());
            }
            if (dump)
            {
                fprintf(outf, "               ");
                int col = 0;
                for (size_t j = 0; j < blocks.size(); j++)
                {
                    print_data(&blocks[j].Value, 0, adiosvartype, true);
                    ++col;
                    if (j < blocks.size() - 1)
                    {
                        if (col < ncols)
                        {
                            fprintf(outf, " ");
                        }
                        else
                        {
                            fprintf(outf, "\n               ");
                            col = 0;
                        }
                    }
                }
                fprintf(outf, "\n");
            }
        }
        return;
    }
    else
    {
        // arrays
        size_t ndim = variable->m_Count.size();
        int ndigits_nblocks;
        for (size_t k = 0; k < ndim; k++)
        {
            // get digit lengths for each dimension
            if (variable->m_ShapeID == ShapeID::GlobalArray)
            {
                ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
            }
            else
            {
                ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
            }
        }

        size_t stepRelative = 0;
        for (auto &blockpair : allblocks)
        {
            size_t stepAbsolute = blockpair.first;
            std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
            const size_t blocksSize = blocks.size();
            fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, stepAbsolute);
            fprintf(outf, "\n");
            ndigits_nblocks = ndigits(blocksSize - 1);

            for (size_t j = 0; j < blocksSize; j++)
            {
                fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

                // just in case ndim for a block changes in LocalArrays:
                ndim = variable->m_Count.size();

                for (size_t k = 0; k < ndim; k++)
                {
                    if (blocks[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k], blocks[j].Start[k],
                                    ndigits_dims[k], blocks[j].Start[k] + blocks[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k], blocks[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                    if (k < ndim - 1)
                        fprintf(outf, ", ");
                }
                fprintf(outf, "]");

                /* Print per-block statistics if available */
                if (longopt)
                {
                    if (true /* TODO: variable->has_minmax */)
                    {
                        fprintf(outf, " = ");
                        print_data(&blocks[j].Min, 0, adiosvartype, false);

                        fprintf(outf, " / ");
                        print_data(&blocks[j].Max, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, "N/A / N/A");
                    }
                }
                fprintf(outf, "\n");
                if (dump)
                {
                    readVarBlock(fp, io, variable, stepRelative, j, blocks[j].Count,
                                 blocks[j].Start);
                }
            }
            ++stepRelative;
        }
    }
}